

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint32_t farmhashsu::Hash32(char *s,size_t len)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 uVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined1 (*pauVar14) [16];
  int iVar15;
  int iVar16;
  uint uVar17;
  uint32_t h;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  if (0x18 < len) {
    if (len < 0x28) {
      iVar16 = *(int *)(s + (len - 0x10)) + (int)len;
      uVar17 = *(int *)(s + (len - 4)) + (int)len;
      iVar7 = *(int *)(s + (len - 0x14));
      uVar5 = crc32(iVar16 + -0x4a380c7d,uVar17);
      uVar5 = util::Mur(iVar7 + 0xb5c7f383U,uVar5);
      uVar5 = util::Mur(uVar17 >> 0x15 | uVar17 * 0x800,uVar5);
      iVar11 = *(int *)(s + (len - 0xc));
      h = uVar17 + uVar5 + iVar11;
      uVar6 = util::Mur(iVar7 + 0xb5c7f383U + *(int *)(s + (len - 8)),h);
      uVar5 = crc32(uVar5 + iVar11 + h,uVar6 * 0x1b873593 + -0x4a380c7d + iVar16);
      uVar5 = farmhashmk::Hash32Len13to24(s,len + 1 >> 1,uVar5);
      uVar5 = uVar5 + uVar6 * 0x1b873593;
    }
    else {
      if (len < 0x50) {
        auVar31._8_4_ = 0xcc9e2d51;
        auVar31._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar31._12_4_ = 0xcc9e2d51;
        auVar24._8_4_ = 0xbe0c56a1;
        auVar24._0_8_ = 0xbe0c56a1be0c56a1;
        auVar24._12_4_ = 0xbe0c56a1;
        auVar25 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar31);
        auVar22 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0xf >> 1)),auVar24);
        auVar26 = vpaddd_avx(*(undefined1 (*) [16])(s + 0x10),auVar24);
        auVar20 = vpaddd_avx(*(undefined1 (*) [16])s,auVar22);
        auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])(s + 0x10));
        auVar28._8_4_ = 0x51;
        auVar28._0_8_ = 0x5100000051;
        auVar28._12_4_ = 0x51;
        auVar19 = vpaddd_avx512vl(auVar20,auVar28);
        auVar20 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x20)),auVar31);
        auVar24 = vpshufd_avx(auVar26,0x39);
        auVar28 = vpaddd_avx(auVar24 ^ *(undefined1 (*) [16])(s + (len - 0xf >> 1)),
                             *(undefined1 (*) [16])s);
        auVar20 = vprold_avx512vl(auVar20,0x11);
        auVar21._8_4_ = 0x1b873593;
        auVar21._0_8_ = 0x1b8735931b873593;
        auVar21._12_4_ = 0x1b873593;
        auVar21 = vpmulld_avx512vl(auVar20,auVar21);
        auVar20 = vpaddd_avx(auVar19,auVar22);
        auVar23 = vpaddd_avx(auVar25 ^ auVar20,*(undefined1 (*) [16])(s + (len - 0x20)));
        auVar30._8_4_ = 0xe6546b64;
        auVar30._0_8_ = 0xe6546b64e6546b64;
        auVar30._12_4_ = 0xe6546b64;
        auVar22 = vprold_avx512vl(auVar21 ^ auVar19,0x13);
        auVar19._8_4_ = 5;
        auVar19._0_8_ = 0x500000005;
        auVar19._12_4_ = 5;
        auVar21 = vpmulld_avx512vl(auVar22,auVar19);
        auVar22 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar30);
        auVar22 = vpaddd_avx(auVar22,auVar21);
        auVar24 = vpshufb_avx(auVar24,auVar20);
        auVar21 = vpshufb_avx(auVar23,auVar22);
        auVar20 = vpaddd_avx(auVar23,auVar28);
        auVar28 = vpaddd_avx(auVar20,auVar28);
        auVar25 = vpaddd_avx(auVar25,auVar24 ^ auVar30);
        auVar28 = vpmulld_avx(auVar28,auVar31);
        auVar25 = vpaddd_avx(auVar25,auVar21);
        auVar23 = vpbroadcastd_avx512vl();
        auVar28 = vpaddd_avx(auVar28,auVar23);
      }
      else {
        uVar8 = (len - 1) / 0x50;
        auVar20._8_4_ = 0xbe0c56a1;
        auVar20._0_8_ = 0xbe0c56a1be0c56a1;
        auVar20._12_4_ = 0xbe0c56a1;
        auVar22._8_8_ = 0x5100000051;
        auVar22._0_8_ = 0x5100000051;
        auVar25._8_8_ = 0xe6546b64e6546b64;
        auVar25._0_8_ = 0xe6546b64e6546b64;
        auVar26._8_8_ = 0xbe0c56a1be0c56a1;
        auVar26._0_8_ = 0xbe0c56a1be0c56a1;
        auVar23._8_4_ = 0xcc9e2d51;
        auVar23._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar23._12_4_ = 0xcc9e2d51;
        uVar9 = uVar8;
        pauVar14 = (undefined1 (*) [16])s;
        auVar28 = auVar20;
        while (bVar18 = uVar9 != 0, uVar9 = uVar9 - 1, bVar18) {
          auVar24 = *pauVar14;
          pauVar1 = pauVar14 + 2;
          pauVar2 = pauVar14 + 3;
          pauVar3 = pauVar14 + 1;
          pauVar4 = pauVar14 + 4;
          pauVar14 = pauVar14 + 5;
          auVar22 = vpaddd_avx(auVar24,auVar22);
          auVar20 = vpaddd_avx(*pauVar1,auVar20);
          auVar28 = vpaddd_avx(*pauVar3,auVar28);
          auVar21 = vpmulld_avx(*pauVar4,auVar23);
          auVar26 = vpaddd_avx(*pauVar4,auVar26);
          auVar22 = vpaddd_avx(auVar22,auVar20);
          auVar19 = vpshufd_avx(auVar28,0x39);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpaddd_avx(*pauVar2,auVar22);
          auVar22 = vprold_avx512vl(auVar22,0x11);
          auVar28 = vpaddd_avx(auVar21,*pauVar3);
          auVar22 = vpmulld_avx(auVar22,auVar23);
          auVar21 = vpshufb_avx(auVar19,auVar20);
          auVar24 = vpaddd_avx(*pauVar1 ^ auVar19,auVar24);
          auVar19 = vpshufb_avx(auVar26,auVar22);
          auVar25 = vpaddd_avx(auVar28,auVar25 ^ auVar21);
          auVar20 = vpaddd_avx(*pauVar2,auVar20 ^ auVar28);
          auVar25 = vpaddd_avx(auVar25,auVar19);
          auVar21 = vpaddd_avx(auVar26,auVar24);
          auVar26 = aesimc(auVar20);
          auVar28 = vpaddd_avx(auVar21,auVar24);
          auVar20 = vpmulld_avx(auVar21,auVar23);
        }
        lVar12 = uVar8 * -0x50 + len;
        if (lVar12 != 0) {
          auVar24 = vpbroadcastd_avx512vl();
          auVar22 = vpaddd_avx(auVar24,auVar22);
          auVar22 = vpaddd_avx(auVar22,*(undefined1 (*) [16])(s + lVar12 + -0x50 + uVar8 * 0x50));
          auVar20 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar12 + -0x30 + uVar8 * 0x50),auVar20);
          auVar28 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar12 + -0x40 + uVar8 * 0x50),auVar28);
          auVar24 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar12 + -0x10 + uVar8 * 0x50),auVar23);
          auVar26 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar12 + -0x10 + uVar8 * 0x50),auVar26);
          auVar22 = vpaddd_avx(auVar22,auVar20);
          auVar19 = vpshufd_avx(auVar28,0x39);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar12 + -0x20 + uVar8 * 0x50),auVar22);
          auVar22 = vprold_avx512vl(auVar22,0x11);
          auVar28 = vpaddd_avx(auVar24,*(undefined1 (*) [16])(s + lVar12 + -0x40 + uVar8 * 0x50));
          auVar22 = vpmulld_avx(auVar22,auVar23);
          auVar21 = vpshufb_avx(auVar19,auVar20);
          auVar24 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar12 + -0x30 + uVar8 * 0x50) ^ auVar19,
                               *(undefined1 (*) [16])(s + lVar12 + -0x50 + uVar8 * 0x50));
          auVar19 = vpshufb_avx(auVar26,auVar22);
          auVar25 = vpaddd_avx(auVar28,auVar25 ^ auVar21);
          auVar20 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar12 + -0x20 + uVar8 * 0x50),
                               auVar20 ^ auVar28);
          auVar25 = vpaddd_avx(auVar25,auVar19);
          auVar21 = vpaddd_avx(auVar26,auVar24);
          auVar26 = aesimc(auVar20);
          auVar28 = vpaddd_avx(auVar21,auVar24);
          auVar20 = vpmulld_avx(auVar21,auVar23);
        }
      }
      auVar28 = vpshufd_avx(auVar28,0x39);
      auVar29._8_4_ = 0x1b873593;
      auVar29._0_8_ = 0x1b8735931b873593;
      auVar29._12_4_ = 0x1b873593;
      auVar25 = vpternlogq_avx512vl(auVar25,auVar26,auVar28,0x96);
      auVar27._8_4_ = 0xcc9e2d51;
      auVar27._0_8_ = 0xcc9e2d51cc9e2d51;
      auVar27._12_4_ = 0xcc9e2d51;
      auVar26 = vpmulld_avx(auVar22 ^ auVar26,auVar29);
      auVar25 = vpmulld_avx(auVar25,auVar29);
      auVar22 = vpmulld_avx(auVar20,auVar27);
      auVar28 = vpmulld_avx(auVar28,auVar27);
      auVar20 = vpshufb_avx(auVar28,auVar22);
      auVar26 = vpaddd_avx(auVar26,auVar22);
      auVar22 = vpaddd_avx(auVar26,auVar22);
      auVar20 = vpaddd_avx(auVar25,auVar20);
      auVar23 = vpshufb_avx(auVar22,auVar26);
      auVar25 = vpaddd_avx(auVar20,auVar28);
      uVar10 = crc32(auVar22._0_4_,auVar22._12_4_);
      auVar20 = vpaddd_avx(auVar25,auVar20);
      iVar7 = crc32(auVar22._4_4_,auVar25._0_4_);
      auVar20 = auVar20 ^ auVar23;
      iVar11 = crc32(uVar10,auVar25._8_4_);
      uVar10 = crc32(auVar22._8_4_ * -0x3361d2af,auVar25._4_4_);
      iVar7 = crc32(iVar7 * -0x3361d2af,auVar25._12_4_);
      iVar16 = crc32(uVar10,auVar20._0_4_);
      uVar10 = crc32(iVar11 * -0x3361d2af,auVar20._4_4_);
      iVar11 = crc32(iVar7,auVar20._8_4_);
      uVar13 = crc32(iVar16 * -0x3361d2af,auVar20._12_4_);
      uVar10 = crc32(uVar10,auVar26._0_4_);
      iVar15 = crc32(iVar11 * -0x3361d2af,auVar26._4_4_);
      iVar16 = crc32(uVar13,auVar26._8_4_);
      iVar11 = crc32(uVar10,auVar26._12_4_);
      uVar5 = ((iVar15 + iVar7) - (iVar11 + iVar16)) * -0x3361d2af;
    }
    return uVar5;
  }
  if (len < 0xd) {
    if (len < 5) {
      uVar5 = farmhashmk::Hash32Len0to4(s,len,0);
      return uVar5;
    }
    uVar5 = farmhashmk::Hash32Len5to12(s,len,0);
    return uVar5;
  }
  uVar5 = farmhashmk::Hash32Len13to24(s,len,0);
  return uVar5;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhashmk::Hash32Len0to4(s, len) :
         farmhashmk::Hash32Len5to12(s, len)) :
        farmhashmk::Hash32Len13to24(s, len);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += Fetch(s + len - 4);
    b += Fetch(s + len - 20);
    c += Fetch(s + len - 16);
    uint32_t d = a;
    a = NAMESPACE_FOR_HASH_FUNCTIONS::Rotate32(a, 21);
    a = Mur(a, Mur(b, _mm_crc32_u32(c, d)));
    a += Fetch(s + len - 12);
    b += Fetch(s + len - 8);
    d += a;
    a += d;
    b = Mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhashmk::Hash32Len13to24(s, (len + 1) / 2, a) + b;
  }

#undef Mulc1
#define Mulc1(x) Mul((x), cc1)

#undef Mulc2
#define Mulc2(x) Mul((x), cc2)

#undef Murk
#define Murk(a, h)                              \
  Add(k,                                        \
      Mul5(                                     \
          Rol19(                                \
              Xor(                              \
                  Mulc2(                        \
                      Rol17(                    \
                          Mulc1(a))),           \
                  (h)))))

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  __m128i q;
  if (len < 80) {
    __m128i a = Fetch128(s);
    __m128i b = Fetch128(s + 16);
    __m128i c = Fetch128(s + (len - 15) / 2);
    __m128i d = Fetch128(s + len - 32);
    __m128i e = Fetch128(s + len - 16);
    h = Add(h, a);
    g = Add(g, b);
    q = g;
    g = Shuffle0321(g);
    f = Add(f, c);
    __m128i be = Add(b, Mulc1(e));
    h = Add(h, f);
    f = Add(f, h);
    h = Add(Murk(d, h), e);
    k = Xor(k, _mm_shuffle_epi8(g, f));
    g = Add(Xor(c, g), a);
    f = Add(Xor(be, f), d);
    k = Add(k, be);
    k = Add(k, _mm_shuffle_epi8(f, h));
    f = Add(f, g);
    g = Add(g, f);
    g = Add(_mm_set1_epi32(len), Mulc1(g));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhashmk::Hash32.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#undef Chunk
#define Chunk() do {                            \
  __m128i a = Fetch128(s);                      \
  __m128i b = Fetch128(s + 16);                 \
  __m128i c = Fetch128(s + 32);                 \
  __m128i d = Fetch128(s + 48);                 \
  __m128i e = Fetch128(s + 64);                 \
  h = Add(h, a);                                \
  g = Add(g, b);                                \
  g = Shuffle0321(g);                           \
  f = Add(f, c);                                \
  __m128i be = Add(b, Mulc1(e));                \
  h = Add(h, f);                                \
  f = Add(f, h);                                \
  h = Add(h, d);                                \
  q = Add(q, e);                                \
  h = Rol17(h);                                 \
  h = Mulc1(h);                                 \
  k = Xor(k, _mm_shuffle_epi8(g, f));           \
  g = Add(Xor(c, g), a);                        \
  f = Add(Xor(be, f), d);                       \
  std::swap(f, q);                              \
  q = _mm_aesimc_si128(q);                      \
  k = Add(k, be);                               \
  k = Add(k, _mm_shuffle_epi8(f, h));           \
  f = Add(f, g);                                \
  g = Add(g, f);                                \
  f = Mulc1(f);                                 \
} while (0)

    q = g;
    while (iters-- != 0) {
      Chunk();
      s += 80;
    }

    if (len != 0) {
      h = Add(h, _mm_set1_epi32(len));
      s = s + len - 80;
      Chunk();
    }
  }

  g = Shuffle0321(g);
  k = Xor(k, g);
  k = Xor(k, q);
  h = Xor(h, q);
  f = Mulc1(f);
  k = Mulc2(k);
  g = Mulc1(g);
  h = Mulc2(h);
  k = Add(k, _mm_shuffle_epi8(g, f));
  h = Add(h, f);
  f = Add(f, h);
  g = Add(g, k);
  k = Add(k, g);
  k = Xor(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = reinterpret_cast<char*>(buf);
  uint32_t x = Fetch(s);
  uint32_t y = Fetch(s+4);
  uint32_t z = Fetch(s+8);
  x = _mm_crc32_u32(x, Fetch(s+12));
  y = _mm_crc32_u32(y, Fetch(s+16));
  z = _mm_crc32_u32(z * c1, Fetch(s+20));
  x = _mm_crc32_u32(x, Fetch(s+24));
  y = _mm_crc32_u32(y * c1, Fetch(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, Fetch(s+32));
  x = _mm_crc32_u32(x * c1, Fetch(s+36));
  y = _mm_crc32_u32(y, Fetch(s+40));
  z = _mm_crc32_u32(z * c1, Fetch(s+44));
  x = _mm_crc32_u32(x, Fetch(s+48));
  y = _mm_crc32_u32(y * c1, Fetch(s+52));
  z = _mm_crc32_u32(z, Fetch(s+56));
  x = _mm_crc32_u32(x, Fetch(s+60));
  return (o - x + y - z) * c1;
}